

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O1

pboolean p_tree_avl_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  int iVar1;
  PTreeBaseNode *pPVar2;
  PTreeAVLNode *node;
  PTreeAVLNode_ *pPVar3;
  pint pVar4;
  PTreeBaseNode_ *pPVar5;
  PTreeBaseNode_ *pPVar6;
  PTreeBaseNode *pPVar7;
  
  pPVar2 = *root_node;
  pPVar7 = pPVar2;
  pPVar6 = (PTreeBaseNode_ *)root_node;
  while (pPVar2 != (PTreeBaseNode *)0x0) {
    pVar4 = (*compare_func)(key,pPVar2->key,data);
    if (pVar4 < 0) {
      pPVar6 = pPVar6->left;
      pPVar7 = pPVar6;
    }
    else {
      if (pVar4 == 0) break;
      pPVar7 = pPVar6->left;
      pPVar6 = (PTreeBaseNode_ *)&pPVar7->right;
    }
    pPVar2 = pPVar6->left;
  }
  if (pPVar6->left == (PTreeBaseNode_ *)0x0) {
    pPVar5 = (PTreeBaseNode_ *)p_malloc0(0x30);
    pPVar6->left = pPVar5;
    if (pPVar5 != (PTreeBaseNode_ *)0x0) {
      pPVar5->key = key;
      pPVar6->left->value = value;
      pPVar5 = pPVar6->left;
      *(undefined4 *)&pPVar5[1].right = 0;
      pPVar5[1].left = pPVar7;
      node = *(PTreeAVLNode **)pPVar6;
      pPVar3 = (*(PTreeAVLNode **)pPVar6)->parent;
      do {
        if (pPVar3 == (PTreeAVLNode_ *)0x0) {
          return 1;
        }
        iVar1 = pPVar3->balance_factor;
        if ((PTreeAVLNode *)(pPVar3->base).left == node) {
          if (iVar1 == -1) goto LAB_0010a542;
          pVar4 = 1;
          if (iVar1 == 1) {
            if (node->balance_factor == -1) {
              pp_tree_avl_rotate_left_right(node,root_node);
              return 1;
            }
            pp_tree_avl_rotate_right(node,root_node);
            return 1;
          }
        }
        else {
          if (iVar1 == 1) {
LAB_0010a542:
            pPVar3->balance_factor = 0;
            return 1;
          }
          pVar4 = -1;
          if (iVar1 == -1) {
            if (node->balance_factor == 1) {
              pp_tree_avl_rotate_right_left(node,root_node);
              return 1;
            }
            pp_tree_avl_rotate_left(node,root_node);
            return 1;
          }
        }
        pPVar3->balance_factor = pVar4;
        node = pPVar3;
        pPVar3 = pPVar3->parent;
      } while( true );
    }
  }
  else {
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(pPVar6->left->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(pPVar6->left->value);
    }
    pPVar6->left->key = key;
    pPVar6->left->value = value;
  }
  return 0;
}

Assistant:

pboolean
p_tree_avl_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeAVLNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeAVLNode *) *cur_node)->balance_factor = 0;
	((PTreeAVLNode *) *cur_node)->parent         = (PTreeAVLNode *) parent_node;

	/* Balance the tree */
	pp_tree_avl_balance_insert (((PTreeAVLNode *) *cur_node), root_node);

	return TRUE;
}